

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TFunction::~TFunction(TFunction *this)

{
  bool bVar1;
  reference pTVar2;
  __normal_iterator<glslang::TParameter_*,_std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>_>
  local_20;
  __normal_iterator<glslang::TParameter_*,_std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>_>
  local_18;
  iterator i;
  TFunction *this_local;
  
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_013a9828;
  i._M_current = (TParameter *)this;
  local_18._M_current =
       (TParameter *)
       std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::begin
                 (&(this->parameters).
                   super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>)
  ;
  while( true ) {
    local_20._M_current =
         (TParameter *)
         std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::end
                   (&(this->parameters).
                     super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                   );
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<glslang::TParameter_*,_std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>_>
             ::operator*(&local_18);
    if (pTVar2->type != (TType *)0x0) {
      (*pTVar2->type->_vptr_TType[1])();
    }
    __gnu_cxx::
    __normal_iterator<glslang::TParameter_*,_std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>_>
    ::operator++(&local_18);
  }
  TSpirvInstruction::~TSpirvInstruction(&this->spirvInst);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&this->mangledName);
  TType::~TType(&this->returnType);
  TVector<glslang::TParameter>::~TVector(&this->parameters);
  TSymbol::~TSymbol(&this->super_TSymbol);
  return;
}

Assistant:

TFunction::~TFunction()
{
    for (TParamList::iterator i = parameters.begin(); i != parameters.end(); ++i)
        delete (*i).type;
}